

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::memory::anon_unknown_0::testImage
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context,
          ImageParams params)

{
  string *psVar1;
  size_type *psVar2;
  pointer puVar3;
  VkImageTiling VVar4;
  VkImageUsageFlags VVar5;
  TestStatus *pTVar6;
  VkDevice device;
  DeviceInterface *vk;
  VkDeviceSize VVar7;
  deUint32 dVar8;
  TestLog *obj;
  bool bVar9;
  int iVar10;
  qpTestResult qVar11;
  uint uVar12;
  InstanceInterface *pIVar13;
  ulong uVar14;
  ostream *poVar15;
  pointer pcVar16;
  NotSupportedError *this_00;
  uint uVar17;
  undefined8 uVar18;
  long lVar19;
  bool bVar20;
  VkImageType VVar21;
  char *pcVar22;
  uint uVar23;
  pointer puVar24;
  VkSampleCountFlagBits VVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  VkFormatProperties VVar29;
  pointer local_668;
  deUint32 local_660;
  undefined4 local_65c;
  undefined4 local_658;
  int local_654;
  Context *local_650;
  VkPhysicalDevice local_648;
  vector<unsigned_int,_std::allocator<unsigned_int>_> usedMemoryTypeIndices;
  TestLog *local_628;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_620;
  InstanceInterface *local_608;
  TestLog *local_600;
  uint local_5f4;
  uint local_5f0;
  uint local_5ec;
  uint local_5e8;
  uint local_5e4;
  uint local_5e0;
  uint local_5dc;
  VkImageCreateInfo local_5d8;
  ulong local_580;
  ulong local_578;
  string local_570 [3];
  ios_base local_500 [264];
  TestStatus *local_3f8;
  ulong local_3f0;
  VkDevice local_3e8;
  DeviceInterface *local_3e0;
  pointer local_3d8;
  VkMemoryRequirements requirements;
  ResultCollector result;
  VkBool32 local_368;
  VkBool32 local_364;
  VkBool32 local_360;
  VkBool32 local_340 [16];
  VkBool32 local_300;
  VkBool32 local_2fc;
  VkBool32 local_2f8;
  VkBool32 local_2f4;
  VkBool32 local_2f0;
  VkBool32 local_2ec;
  VkPhysicalDeviceMemoryProperties memoryProperties;
  
  uVar18 = params._0_8_;
  local_3e0 = Context::getDeviceInterface((Context *)this);
  pIVar13 = Context::getInstanceInterface((Context *)this);
  local_3e8 = Context::getDevice((Context *)this);
  local_648 = Context::getPhysicalDevice((Context *)this);
  local_608 = pIVar13;
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)&memoryProperties,pIVar13,local_648);
  local_650 = context;
  if ((((ulong)context & 1) == 0) || (memoryProperties.memoryTypes[0x15].heapIndex != 0)) {
    if ((((ulong)context & 2) == 0) ||
       ((memoryProperties.memoryTypes[0x16].heapIndex != 0 ||
        (memoryProperties.memoryTypes[0x17].propertyFlags != 0)))) {
      if ((((ulong)context & 4) == 0) || (memoryProperties.memoryTypes[0x19].heapIndex != 0)) {
        local_3f8 = __return_storage_ptr__;
        ::vk::getPhysicalDeviceMemoryProperties(&memoryProperties,local_608,local_648);
        local_600 = *(TestLog **)(*(long *)this + 0x10);
        psVar1 = &result.m_prefix;
        result.m_log = local_600;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)psVar1,
                   "Verify memory requirements for the following parameter combinations:",0x44);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&result,(EndMessageToken *)&tcu::TestLog::EndMessage);
        local_578 = (ulong)local_650 >> 0x20;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
        std::ios_base::~ios_base((ios_base *)local_340);
        local_5ec = (params.flags & 1) << 6;
        local_654 = 0;
        bVar20 = true;
        uVar18 = CONCAT71((int7)((ulong)uVar18 >> 8),1);
        pIVar13 = local_608;
        uVar12 = 0;
        do {
          local_5f0 = uVar12;
          local_5f4 = (uint)uVar18;
          bVar9 = SUB41(local_5f0,0);
          uVar14 = 1;
          local_660 = 0xffffffff;
          do {
            local_580 = uVar14;
            if (bVar9 != (int)uVar14 - 0x83U < 0xfffffff9) {
              if ((local_5f0 & 1) != 0) {
                local_660 = 0xffffffff;
              }
              VVar21 = VK_IMAGE_TYPE_1D;
              do {
                uVar14 = 0;
                do {
                  bVar26 = local_578 == 0;
                  local_5e0 = (uint)uVar14 | (uint)local_650;
                  uVar17 = local_5e0 & 0x10;
                  local_5e4 = (uVar17 >> 4) * 5 + 1;
                  uVar12 = 1;
                  local_3f0 = uVar14;
                  do {
                    local_5dc = uVar12 | local_5ec;
                    local_5e8 = local_5dc & 0xf0;
                    bVar27 = local_5e8 != 0x40;
                    VVar25 = VK_SAMPLE_COUNT_1_BIT;
                    do {
                      local_5d8.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
                      local_5d8.pNext = (void *)0x0;
                      local_5d8.flags = local_5e0;
                      local_5d8.format = (VkFormat)local_580;
                      local_5d8.extent.depth = 1;
                      if (VVar21 == VK_IMAGE_TYPE_1D) {
                        local_5d8.extent.width = 0x40;
                        local_5d8.extent.height = 1;
                      }
                      else {
                        local_5d8.extent.depth = 1;
                        if (VVar21 != VK_IMAGE_TYPE_2D) {
                          local_5d8.extent.depth = 4;
                        }
                        local_5d8.extent.width = 0x40;
                        local_5d8.extent.height = 0x40;
                      }
                      local_5d8.mipLevels = 1;
                      local_5d8.arrayLayers = local_5e4;
                      local_5d8.tiling = (VkImageTiling)local_578;
                      local_5d8.usage = local_5dc;
                      local_5d8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
                      local_5d8.queueFamilyIndexCount = 0;
                      local_5d8.pQueueFamilyIndices = (deUint32 *)0x0;
                      local_5d8.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
                      local_5d8.imageType = VVar21;
                      local_5d8.samples = VVar25;
                      if (VVar21 == VK_IMAGE_TYPE_2D || uVar17 == 0) {
                        if (VVar25 == VK_SAMPLE_COUNT_1_BIT) {
                          if (local_5e8 != 0x40) {
LAB_0068a3f0:
                            ::vk::getPhysicalDeviceFeatures
                                      ((VkPhysicalDeviceFeatures *)&result,pIVar13,local_648);
                            if ((((local_5d8.flags & 2) == 0) ||
                                (((((local_5d8.imageType != VK_IMAGE_TYPE_2D || (local_300 != 0)) &&
                                   ((local_5d8.imageType != VK_IMAGE_TYPE_3D || (local_2fc != 0))))
                                  && (((local_5d8.samples != VK_SAMPLE_COUNT_2_BIT ||
                                       (local_2f8 != 0)) &&
                                      ((local_5d8.samples != VK_SAMPLE_COUNT_4_BIT ||
                                       (local_2f4 != 0)))))) &&
                                 ((((local_5d8.samples != VK_SAMPLE_COUNT_8_BIT || (local_2f0 != 0))
                                   && ((local_5d8.samples != VK_SAMPLE_COUNT_16_BIT ||
                                       (local_2ec != 0)))) &&
                                  ((local_5d8.samples != VK_SAMPLE_COUNT_32_BIT &&
                                   (local_5d8.samples != VK_SAMPLE_COUNT_64_BIT)))))))) &&
                               ((local_5d8.samples == VK_SAMPLE_COUNT_1_BIT ||
                                (((local_5d8.usage & 8) == 0 || (local_340[0] != 0)))))) {
                              uVar23 = local_5d8.format - VK_FORMAT_BC1_RGB_UNORM_BLOCK;
                              if (uVar23 < 0x36) {
                                if ((0x3ffffffc000000U >> ((ulong)uVar23 & 0x3f) & 1) == 0) {
                                  if ((short)(1L << ((byte)uVar23 & 0x3f)) == 0) {
                                    if (local_368 != 0) goto LAB_0068a53e;
                                  }
                                  else if (local_360 != 0) goto LAB_0068a53e;
                                  goto LAB_0068af6a;
                                }
                                if (local_364 == 0) goto LAB_0068af6a;
                              }
LAB_0068a53e:
                              VVar29 = ::vk::getPhysicalDeviceFormatProperties
                                                 (pIVar13,local_648,local_5d8.format);
                              uVar14 = VVar29._0_8_ >> 0x20;
                              if (local_5d8.tiling == VK_IMAGE_TILING_LINEAR) {
                                uVar14 = (ulong)VVar29.linearTilingFeatures;
                              }
                              if ((((((local_5d8.usage & 4) != 0) && ((uVar14 & 1) != 0)) ||
                                   (((local_5d8.usage & 8) != 0 && ((uVar14 & 2) != 0)))) ||
                                  ((((local_5d8.usage & 0x90) != 0 && ((uVar14 & 0x80) != 0)) ||
                                   (((local_5d8.usage & 0x20) != 0 && ((uVar14 & 0x200) != 0))))))
                                 && ((((iVar10 = (*pIVar13->_vptr_InstanceInterface[4])
                                                           (pIVar13,local_648,
                                                            (ulong)local_5d8.format,
                                                            (ulong)local_5d8.imageType,
                                                            (ulong)local_5d8.tiling,
                                                            (ulong)local_5d8.usage,
                                                            (ulong)local_5d8.flags,local_570),
                                       iVar10 == 0 &&
                                       (local_5d8.arrayLayers <= (uint)local_570[0].field_2._0_4_))
                                      && (local_5d8.mipLevels <= local_570[0]._M_string_length._4_4_
                                         )) && ((local_5d8.samples &
                                                local_570[0].field_2._M_allocated_capacity._4_4_) !=
                                                0)))) {
                                result.m_log = local_600;
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)&result.m_prefix);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&result.m_prefix,"- ",2);
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_570);
                                if ((ulong)local_5d8.imageType < 3) {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_570,
                                             &DAT_00b2f17c +
                                             *(int *)(&DAT_00b2f17c + (ulong)local_5d8.imageType * 4
                                                     ),3);
                                }
                                if (local_5d8.tiling == VK_IMAGE_TILING_OPTIMAL) {
                                  lVar19 = 10;
                                  pcVar22 = "(optimal) ";
LAB_0068a6b8:
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_570,pcVar22,lVar19);
                                }
                                else if (local_5d8.tiling == VK_IMAGE_TILING_LINEAR) {
                                  lVar19 = 9;
                                  pcVar22 = "(linear) ";
                                  goto LAB_0068a6b8;
                                }
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_570,"extent:[",8);
                                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_570);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
                                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
                                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
                                usedMemoryTypeIndices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     (pointer)::vk::getFormatName;
                                usedMemoryTypeIndices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_4_ = local_5d8.format;
                                poVar15 = tcu::Format::Enum<vk::VkFormat,_4UL>::toStream
                                                    ((Enum<vk::VkFormat,_4UL> *)
                                                     &usedMemoryTypeIndices,(ostream *)local_570);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_570,"samples:",8);
                                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_570);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_570,"flags:",6);
                                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_570);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_570,"usage:",6);
                                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_570);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                                std::__cxx11::stringbuf::str();
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_570);
                                std::ios_base::~ios_base(local_500);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&result.m_prefix,(char *)local_628,
                                           (long)DStack_620.m_deviceIface);
                                tcu::MessageBuilder::operator<<
                                          ((MessageBuilder *)&result,
                                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                                if (local_628 != (TestLog *)&DStack_620.m_device) {
                                  operator_delete(local_628,(ulong)(DStack_620.m_device + 1));
                                }
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)&result.m_prefix);
                                std::ios_base::~ios_base((ios_base *)local_340);
                                vk = local_3e0;
                                device = local_3e8;
                                ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&result,
                                                  local_3e0,local_3e8,&local_5d8,
                                                  (VkAllocationCallbacks *)0x0);
                                obj = result.m_log;
                                DStack_620.m_device = (VkDevice)result.m_prefix._M_string_length;
                                DStack_620.m_allocator =
                                     (VkAllocationCallbacks *)
                                     result.m_prefix.field_2._M_allocated_capacity;
                                local_628 = result.m_log;
                                DStack_620.m_deviceIface =
                                     (DeviceInterface *)result.m_prefix._M_dataplus._M_p;
                                ::vk::getImageMemoryRequirements
                                          (&requirements,vk,device,(VkImage)result.m_log);
                                local_570[0]._M_dataplus._M_p = (pointer)&local_570[0].field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_570,"ERROR: ","");
                                tcu::ResultCollector::ResultCollector(&result,local_600,local_570);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_570[0]._M_dataplus._M_p != &local_570[0].field_2) {
                                  operator_delete(local_570[0]._M_dataplus._M_p,
                                                  local_570[0].field_2._M_allocated_capacity + 1);
                                }
                                dVar8 = requirements.memoryTypeBits;
                                local_570[0]._M_dataplus._M_p = (pointer)&local_570[0].field_2;
                                usedMemoryTypeIndices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000033;
                                local_570[0]._M_dataplus._M_p =
                                     (pointer)std::__cxx11::string::_M_create
                                                        ((ulong *)local_570,
                                                         (ulong)&usedMemoryTypeIndices);
                                local_570[0].field_2._M_allocated_capacity =
                                     usedMemoryTypeIndices.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                                builtin_strncpy(local_570[0]._M_dataplus._M_p,
                                                "VkMemoryRequirements memoryTypeBits has no bits set"
                                                ,0x33);
                                local_570[0]._M_string_length =
                                     (size_type)
                                     usedMemoryTypeIndices.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                                local_570[0]._M_dataplus._M_p
                                [(long)usedMemoryTypeIndices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start] = '\0';
                                bVar28 = tcu::ResultCollector::check(&result,dVar8 != 0,local_570);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_570[0]._M_dataplus._M_p != &local_570[0].field_2) {
                                  operator_delete(local_570[0]._M_dataplus._M_p,
                                                  local_570[0].field_2._M_allocated_capacity + 1);
                                }
                                if (bVar28) {
                                  bitsToIndices(&usedMemoryTypeIndices,requirements.memoryTypeBits);
                                  if (usedMemoryTypeIndices.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start ==
                                      (pointer)CONCAT44(usedMemoryTypeIndices.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                                  (VkFormat)
                                                  usedMemoryTypeIndices.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)) {
                                    local_658 = 0;
                                    local_65c = 0;
                                  }
                                  else {
                                    local_65c = 0;
                                    local_658 = 0;
                                    puVar24 = usedMemoryTypeIndices.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start;
                                    do {
                                      VVar5 = local_5d8.usage;
                                      if (*puVar24 < memoryProperties.memoryTypeCount) {
                                        uVar23 = memoryProperties.memoryTypes[*puVar24].
                                                 propertyFlags;
                                        local_658 = CONCAT31((int3)((uint)local_658 >> 8),
                                                             (byte)local_658 | (byte)uVar23);
                                        local_65c = CONCAT31((int3)((uint)local_65c >> 8),
                                                             (byte)local_65c | (uVar23 & 6) != 0);
                                        if ((uVar23 & 0x10) != 0) {
                                          local_570[0]._M_dataplus._M_p =
                                               (pointer)&local_570[0].field_2;
                                          local_668 = (pointer)0x61;
                                          pcVar16 = (pointer)std::__cxx11::string::_M_create
                                                                       ((ulong *)local_570,
                                                                        (ulong)&local_668);
                                          local_3d8 = local_668;
                                          local_570[0].field_2._M_allocated_capacity = local_668;
                                          local_570[0]._M_dataplus._M_p = pcVar16;
                                          memcpy(pcVar16,
                                                 "Memory type includes VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT for a non-transient attachment image"
                                                 ,0x61);
                                          local_570[0]._M_string_length = (size_type)local_3d8;
                                          pcVar16[(long)local_3d8] = '\0';
                                          tcu::ResultCollector::check
                                                    (&result,SUB41((VVar5 & 0x40) >> 6,0),local_570)
                                          ;
                                          goto LAB_0068abec;
                                        }
                                      }
                                      else {
                                        local_570[0]._M_dataplus._M_p =
                                             (pointer)&local_570[0].field_2;
                                        local_668 = (pointer)0x4f;
                                        pcVar16 = (pointer)std::__cxx11::string::_M_create
                                                                     ((ulong *)local_570,
                                                                      (ulong)&local_668);
                                        puVar3 = local_668;
                                        local_570[0].field_2._M_allocated_capacity = local_668;
                                        local_570[0]._M_dataplus._M_p = pcVar16;
                                        memcpy(pcVar16,
                                               "VkMemoryRequirements memoryTypeBits contains bits for non-existing memory types"
                                               ,0x4f);
                                        local_570[0]._M_string_length = (size_type)puVar3;
                                        pcVar16[(long)puVar3] = '\0';
                                        tcu::ResultCollector::fail(&result,local_570);
LAB_0068abec:
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_570[0]._M_dataplus._M_p !=
                                            &local_570[0].field_2) {
                                          operator_delete(local_570[0]._M_dataplus._M_p,
                                                          local_570[0].field_2._M_allocated_capacity
                                                          + 1);
                                        }
                                      }
                                      puVar24 = puVar24 + 1;
                                    } while (puVar24 !=
                                             (uint *)CONCAT44(usedMemoryTypeIndices.
                                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                                  (VkFormat)
                                                  usedMemoryTypeIndices.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish));
                                  }
                                  VVar7 = requirements.alignment;
                                  local_570[0]._M_dataplus._M_p = (pointer)&local_570[0].field_2;
                                  local_668 = (pointer)0x31;
                                  local_570[0]._M_dataplus._M_p =
                                       (pointer)std::__cxx11::string::_M_create
                                                          ((ulong *)local_570,(ulong)&local_668);
                                  local_570[0].field_2._M_allocated_capacity = local_668;
                                  builtin_strncpy(local_570[0]._M_dataplus._M_p,
                                                  "VkMemoryRequirements alignment isn\'t power of two"
                                                  ,0x31);
                                  local_570[0]._M_string_length = (size_type)local_668;
                                  local_570[0]._M_dataplus._M_p[(long)local_668] = '\0';
                                  tcu::ResultCollector::check
                                            (&result,(VVar7 & VVar7 - 1) == 0,local_570);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_570[0]._M_dataplus._M_p != &local_570[0].field_2) {
                                    operator_delete(local_570[0]._M_dataplus._M_p,
                                                    local_570[0].field_2._M_allocated_capacity + 1);
                                  }
                                  local_570[0]._M_dataplus._M_p = (pointer)&local_570[0].field_2;
                                  local_668 = (pointer)0x4e;
                                  pcVar16 = (pointer)std::__cxx11::string::_M_create
                                                               ((ulong *)local_570,(ulong)&local_668
                                                               );
                                  puVar24 = local_668;
                                  local_570[0].field_2._M_allocated_capacity = local_668;
                                  local_570[0]._M_dataplus._M_p = pcVar16;
                                  memcpy(pcVar16,
                                         "None of the required memory types included VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT"
                                         ,0x4e);
                                  local_570[0]._M_string_length = (size_type)puVar24;
                                  pcVar16[(long)puVar24] = '\0';
                                  tcu::ResultCollector::check
                                            (&result,(bool)((byte)local_658 & 1),local_570);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_570[0]._M_dataplus._M_p != &local_570[0].field_2) {
                                    operator_delete(local_570[0]._M_dataplus._M_p,
                                                    local_570[0].field_2._M_allocated_capacity + 1);
                                  }
                                  VVar4 = local_5d8.tiling;
                                  local_570[0]._M_dataplus._M_p = (pointer)&local_570[0].field_2;
                                  local_668 = (pointer)0x71;
                                  pcVar16 = (pointer)std::__cxx11::string::_M_create
                                                               ((ulong *)local_570,(ulong)&local_668
                                                               );
                                  puVar24 = local_668;
                                  local_570[0].field_2._M_allocated_capacity = local_668;
                                  local_570[0]._M_dataplus._M_p = pcVar16;
                                  memcpy(pcVar16,
                                         "Required memory type doesn\'t include VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT and VK_MEMORY_PROPERTY_HOST_COHERENT_BIT"
                                         ,0x71);
                                  local_570[0]._M_string_length = (size_type)puVar24;
                                  pcVar16[(long)puVar24] = '\0';
                                  tcu::ResultCollector::check
                                            (&result,(bool)(VVar4 == VK_IMAGE_TILING_OPTIMAL |
                                                           (byte)local_65c & 1),local_570);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_570[0]._M_dataplus._M_p != &local_570[0].field_2) {
                                    operator_delete(local_570[0]._M_dataplus._M_p,
                                                    local_570[0].field_2._M_allocated_capacity + 1);
                                  }
                                  pIVar13 = local_608;
                                  if (usedMemoryTypeIndices.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(usedMemoryTypeIndices.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)usedMemoryTypeIndices.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)usedMemoryTypeIndices.
                                                                                                                    
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                }
                                dVar8 = requirements.memoryTypeBits;
                                local_570[0]._M_dataplus._M_p = (pointer)&local_570[0].field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_570,
                                           "memoryTypeBits differ from the ones in the previous image configuration"
                                           ,"");
                                tcu::ResultCollector::check
                                          (&result,dVar8 == local_660 || local_660 == 0xffffffff,
                                           local_570);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_570[0]._M_dataplus._M_p != &local_570[0].field_2) {
                                  operator_delete(local_570[0]._M_dataplus._M_p,
                                                  local_570[0].field_2._M_allocated_capacity + 1);
                                }
                                qVar11 = tcu::ResultCollector::getResult(&result);
                                local_660 = requirements.memoryTypeBits;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)result.m_message._M_dataplus._M_p !=
                                    &result.m_message.field_2) {
                                  operator_delete(result.m_message._M_dataplus._M_p,
                                                  result.m_message.field_2._M_allocated_capacity + 1
                                                 );
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)result.m_prefix._M_dataplus._M_p != &result.m_prefix.field_2)
                                {
                                  operator_delete(result.m_prefix._M_dataplus._M_p,
                                                  result.m_prefix.field_2._M_allocated_capacity + 1)
                                  ;
                                }
                                if (obj != (TestLog *)0x0) {
                                  ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::
                                  operator()(&DStack_620,(VkImage)obj);
                                }
                                local_654 = local_654 + 1;
                                bVar20 = (bool)(bVar20 & qVar11 == QP_TEST_RESULT_PASS);
                              }
                            }
                          }
                        }
                        else if (bVar27 && ((VVar21 == VK_IMAGE_TYPE_2D && uVar17 == 0) && bVar26))
                        goto LAB_0068a3f0;
                      }
LAB_0068af6a:
                      bVar28 = VVar25 == 0;
                      VVar25 = VVar25 * 2;
                      if (bVar28) {
                        VVar25 = VK_SAMPLE_COUNT_1_BIT;
                      }
                      uVar23 = uVar12;
                    } while ((int)VVar25 < 0x11);
                    do {
                      uVar12 = uVar23 * 2;
                      if (uVar23 == 0) {
                        uVar12 = 1;
                      }
                      uVar23 = uVar23 * 2;
                    } while ((uVar12 & 0x40) != 0);
                    uVar14 = local_3f0;
                  } while (uVar12 < 0x81);
                  do {
                    uVar12 = (int)uVar14 * 2;
                    if ((int)uVar14 == 0) {
                      uVar12 = 1;
                    }
                    uVar14 = (ulong)uVar12;
                  } while ((uVar12 & 7) != 0);
                } while (uVar12 < 0x11);
                VVar21 = VVar21 + VK_IMAGE_TYPE_2D;
              } while (VVar21 != VK_IMAGE_TYPE_LAST);
            }
            pTVar6 = local_3f8;
            uVar12 = (int)local_580 + 1;
            uVar14 = (ulong)uVar12;
          } while (uVar12 != 0xb9);
          uVar18 = 0;
          uVar12 = 1;
          if ((local_5f4 & 1) == 0) {
            if (local_654 == 0) {
              psVar1 = &result.m_prefix;
              result.m_log = local_600;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar1,
                         "NOTE: No supported image configurations -- nothing to check",0x3b);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&result,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
              std::ios_base::~ios_base((ios_base *)local_340);
            }
            psVar2 = &result.m_prefix._M_string_length;
            result.m_log = (TestLog *)psVar2;
            if (bVar20) {
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"Pass","");
              pTVar6->m_code = QP_TEST_RESULT_PASS;
              (pTVar6->m_description)._M_dataplus._M_p = (pointer)&(pTVar6->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&pTVar6->m_description,result.m_log,
                         result.m_prefix._M_dataplus._M_p + (long)result.m_log);
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&result,"Some memory requirements were incorrect","");
              pTVar6->m_code = QP_TEST_RESULT_FAIL;
              (pTVar6->m_description)._M_dataplus._M_p = (pointer)&(pTVar6->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&pTVar6->m_description,result.m_log,
                         result.m_prefix._M_dataplus._M_p + (long)result.m_log);
            }
            if (result.m_log != (TestLog *)psVar2) {
              operator_delete(result.m_log,result.m_prefix._M_string_length + 1);
            }
            return pTVar6;
          }
        } while( true );
      }
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Feature not supported: sparseResidencyAliased",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryRequirementsTests.cpp"
                 ,0x10d);
    }
    else {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Feature not supported: sparseResidencyImage (2D and 3D)",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryRequirementsTests.cpp"
                 ,0x10a);
    }
  }
  else {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Feature not supported: sparseBinding",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryRequirementsTests.cpp"
               ,0x107);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus testImage (Context& context, const ImageParams params)
{
	const DeviceInterface&		vk				= context.getDeviceInterface();
	const InstanceInterface&	vki				= context.getInstanceInterface();
	const VkDevice				device			= context.getDevice();
	const VkPhysicalDevice		physDevice		= context.getPhysicalDevice();
	const VkImageCreateFlags	sparseFlags		= VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT | VK_IMAGE_CREATE_SPARSE_ALIASED_BIT;
	const VkImageUsageFlags		transientFlags	= VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT;

	requireImageSparseFeatures(vki, physDevice, params.flags);

	const VkPhysicalDeviceMemoryProperties	memoryProperties		= getPhysicalDeviceMemoryProperties(vki, physDevice);
	const deUint32							notInitializedBits		= ~0u;
	const VkImageAspectFlags				colorAspect				= VK_IMAGE_ASPECT_COLOR_BIT;
	const VkImageAspectFlags				depthStencilAspect		= VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
	const VkImageAspectFlags				allAspects[2]			= { colorAspect, depthStencilAspect };
	tcu::TestLog&							log						= context.getTestContext().getLog();
	bool									allPass					= true;
	deUint32								numCheckedImages		= 0u;

	log << tcu::TestLog::Message << "Verify memory requirements for the following parameter combinations:" << tcu::TestLog::EndMessage;

	for (deUint32 loopAspectNdx = 0u; loopAspectNdx < DE_LENGTH_OF_ARRAY(allAspects); ++loopAspectNdx)
	{
		const VkImageAspectFlags	aspect					= allAspects[loopAspectNdx];
		deUint32					previousMemoryTypeBits	= notInitializedBits;

		for (VkFormat loopFormat = VK_FORMAT_R4G4_UNORM_PACK8; loopFormat <= VK_FORMAT_ASTC_12x12_SRGB_BLOCK; loopFormat = nextEnum(loopFormat))
		if  (isFormatMatchingAspect(loopFormat, aspect))
		{
			// memoryTypeBits may differ between depth/stencil formats
			if (aspect == depthStencilAspect)
				previousMemoryTypeBits = notInitializedBits;

			for (VkImageType			loopImageType	= VK_IMAGE_TYPE_1D;					loopImageType	!= VK_IMAGE_TYPE_LAST;					loopImageType	= nextEnum(loopImageType))
			for (VkImageCreateFlags		loopCreateFlags	= (VkImageCreateFlags)0;			loopCreateFlags	<= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;	loopCreateFlags	= nextFlagExcluding(loopCreateFlags, sparseFlags))
			for (VkImageUsageFlags		loopUsageFlags	= VK_IMAGE_USAGE_TRANSFER_SRC_BIT;	loopUsageFlags	<= VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;	loopUsageFlags	= nextFlagExcluding(loopUsageFlags, transientFlags))
			for (VkSampleCountFlagBits	loopSampleCount	= VK_SAMPLE_COUNT_1_BIT;			loopSampleCount	<= VK_SAMPLE_COUNT_16_BIT;				loopSampleCount	= nextFlag(loopSampleCount))
			{
				const VkImageCreateFlags	actualCreateFlags	= loopCreateFlags | params.flags;
				const VkImageUsageFlags		actualUsageFlags	= loopUsageFlags  | (params.transient ? VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT : (VkImageUsageFlagBits)0);
				const bool					isCube				= (actualCreateFlags & VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT) != 0u;
				const VkImageCreateInfo		imageInfo			=
				{
					VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType          sType;
					DE_NULL,									// const void*              pNext;
					actualCreateFlags,							// VkImageCreateFlags       flags;
					loopImageType,								// VkImageType              imageType;
					loopFormat,									// VkFormat                 format;
					makeExtentForImage(loopImageType),			// VkExtent3D               extent;
					1u,											// uint32_t                 mipLevels;
					(isCube ? 6u : 1u),							// uint32_t                 arrayLayers;
					loopSampleCount,							// VkSampleCountFlagBits    samples;
					params.tiling,								// VkImageTiling            tiling;
					actualUsageFlags,							// VkImageUsageFlags        usage;
					VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode            sharingMode;
					0u,											// uint32_t                 queueFamilyIndexCount;
					DE_NULL,									// const uint32_t*          pQueueFamilyIndices;
					VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout            initialLayout;
				};

				if (!isImageSupported(vki, physDevice, imageInfo))
					continue;

				log << tcu::TestLog::Message << "- " << getImageInfoString(imageInfo) << tcu::TestLog::EndMessage;
				++numCheckedImages;

				const Unique<VkImage>		image			(createImage(vk, device, &imageInfo));
				const VkMemoryRequirements	requirements	= getImageMemoryRequirements(vk, device, *image);
				tcu::ResultCollector		result			(log, "ERROR: ");

				verifyImageRequirements(result, memoryProperties, requirements, imageInfo);

				// For the same tiling, transient usage, and sparse flags, (and format, if D/S) memoryTypeBits must be the same for all images
				result.check((previousMemoryTypeBits == notInitializedBits) || (requirements.memoryTypeBits == previousMemoryTypeBits),
								"memoryTypeBits differ from the ones in the previous image configuration");

				if (result.getResult() != QP_TEST_RESULT_PASS)
					allPass = false;

				previousMemoryTypeBits = requirements.memoryTypeBits;
			}
		}
	}

	if (numCheckedImages == 0u)
		log << tcu::TestLog::Message << "NOTE: No supported image configurations -- nothing to check" << tcu::TestLog::EndMessage;

	return allPass ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Some memory requirements were incorrect");
}